

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_writer.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnWriter::HandleRepeatLevels
          (ColumnWriter *this,ColumnWriterState *state,ColumnWriterState *parent,idx_t count,
          idx_t max_repeat)

{
  pointer puVar1;
  ulong uVar2;
  
  if (parent != (ColumnWriterState *)0x0) {
    while( true ) {
      uVar2 = (long)(state->repetition_levels).
                    super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(state->repetition_levels).
                    super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start;
      puVar1 = (parent->repetition_levels).
               super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(parent->repetition_levels).
                        super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar1) <= uVar2) break;
      ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                (&(state->repetition_levels).
                  super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                 (value_type_conflict8 *)((long)puVar1 + uVar2));
    }
  }
  return;
}

Assistant:

void ColumnWriter::HandleRepeatLevels(ColumnWriterState &state, ColumnWriterState *parent, idx_t count,
                                      idx_t max_repeat) const {
	if (!parent) {
		// no repeat levels without a parent node
		return;
	}
	while (state.repetition_levels.size() < parent->repetition_levels.size()) {
		state.repetition_levels.push_back(parent->repetition_levels[state.repetition_levels.size()]);
	}
}